

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint64_t uVar104;
  uint64_t uVar105;
  int iVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  secp256k1_fe local_58;
  
  (r->x).n[4] = x->n[4];
  uVar5 = x->n[0];
  uVar104 = x->n[1];
  uVar105 = x->n[3];
  (r->x).n[2] = x->n[2];
  (r->x).n[3] = uVar105;
  (r->x).n[0] = uVar5;
  (r->x).n[1] = uVar104;
  uVar114 = x->n[0];
  uVar1 = x->n[1];
  uVar2 = x->n[3];
  uVar107 = uVar114 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar107;
  uVar3 = x->n[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar1 * 2;
  uVar4 = x->n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar4;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar8 * auVar60,0);
  auVar6 = auVar9 * ZEXT816(0x1000003d10) + auVar7 * auVar59 + auVar6 * auVar58;
  uVar108 = uVar4 * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar108;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar114;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar1 * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar8 * auVar60,8);
  auVar10 = auVar13 * ZEXT816(0x1000003d10000) +
            auVar10 * auVar61 + auVar12 * auVar63 + auVar11 * auVar62 + (auVar6 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar114;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar114;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar108;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar3 * 2;
  auVar7 = auVar16 * auVar66 + auVar15 * auVar65 + (auVar10 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar10._6_2_ & 0xf);
  auVar8 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar64;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar107;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar108;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar2;
  auVar7 = auVar20 * auVar69 + auVar19 * auVar68 + (auVar7 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar11 = auVar21 * ZEXT816(0x1000003d10) + auVar18 * auVar67 + (auVar8 >> 0x34);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar3;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar107;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar108;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar2;
  auVar7 = auVar24 * auVar72 + (auVar7 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar7._0_8_;
  auVar9 = auVar22 * auVar70 + auVar23 * auVar71 + auVar25 * ZEXT816(0x1000003d10) +
           (auVar11 >> 0x34);
  auVar12 = auVar9 >> 0x34;
  auVar99._8_8_ = auVar12._8_8_;
  auVar99._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = auVar12._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar7._8_8_;
  auVar100 = auVar26 * ZEXT816(0x1000003d10000) + auVar99 + auVar100;
  uVar107 = auVar100._0_8_;
  uVar112 = (auVar100._8_8_ << 0xc | uVar107 >> 0x34) + (auVar10._0_8_ & 0xffffffffffff);
  uVar107 = uVar107 & 0xfffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar107;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar114;
  uVar113 = auVar9._0_8_ & 0xfffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar113;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar1;
  uVar111 = auVar11._0_8_ & 0xfffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar111;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar3;
  uVar108 = auVar8._0_8_ & 0xfffffffffffff;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar108;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar112;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar4;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SUB168(auVar31 * auVar77,0);
  auVar6 = auVar32 * ZEXT816(0x1000003d10) +
           auVar28 * auVar74 + auVar30 * auVar76 + auVar29 * auVar75 + auVar27 * auVar73;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar112;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar114;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar107;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar113;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar3;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar111;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar108;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar4;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SUB168(auVar31 * auVar77,8);
  auVar7 = auVar38 * ZEXT816(0x1000003d10000) +
           auVar34 * auVar79 + auVar35 * auVar80 + auVar37 * auVar82 + auVar36 * auVar81 +
           auVar33 * auVar78 + (auVar6 >> 0x34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar108;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar114;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar112;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar107;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar3;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar113;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar111;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar4;
  auVar8 = (auVar7 >> 0x34) +
           auVar43 * auVar87 + auVar42 * auVar86 + auVar41 * auVar85 + auVar40 * auVar84;
  uVar109 = auVar8._0_8_;
  uVar110 = auVar8._8_8_;
  auVar101._8_8_ = uVar110 >> 0x34;
  auVar101._0_8_ = uVar110 * 0x1000 | uVar109 >> 0x34;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar109 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar7._6_2_ & 0xf);
  auVar8 = auVar44 * ZEXT816(0x1000003d1) + auVar39 * auVar83;
  uVar109 = auVar8._0_8_;
  uVar110 = auVar8._8_8_;
  auVar98._8_8_ = uVar110 >> 0x34;
  auVar98._0_8_ = uVar110 * 0x1000 | uVar109 >> 0x34;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar111;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar114;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar108;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar112;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar3;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar107;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar113;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar4;
  auVar101 = auVar47 * auVar90 + auVar49 * auVar92 + auVar48 * auVar91 + auVar101;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar101._0_8_ & 0xfffffffffffff;
  auVar98 = auVar50 * ZEXT816(0x1000003d10) + auVar46 * auVar89 + auVar45 * auVar88 + auVar98;
  local_58.n[1] = auVar98._0_8_ & 0xfffffffffffff;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar113;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar114;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar111;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar108;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar3;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar112;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar107;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar4;
  auVar8 = auVar55 * auVar97 + auVar54 * auVar96 + (auVar101 >> 0x34);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar8._0_8_;
  auVar9 = auVar56 * ZEXT816(0x1000003d10) +
           auVar51 * auVar93 + auVar53 * auVar95 + auVar52 * auVar94 + (auVar98 >> 0x34);
  auVar10 = auVar9 >> 0x34;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar10._0_8_;
  local_58.n[2] = auVar9._0_8_ & 0xfffffffffffff;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar8._8_8_;
  auVar102._8_8_ = auVar10._8_8_;
  auVar102._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar103 = auVar57 * ZEXT816(0x1000003d10000) + auVar102 + auVar103;
  uVar114 = auVar103._0_8_;
  local_58.n[3] = uVar114 & 0xfffffffffffff;
  local_58.n[4] = (auVar103._8_8_ << 0xc | uVar114 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
  r->infinity = 0;
  local_58.n[0] = (uVar109 & 0xfffffffffffff) + 7;
  iVar106 = secp256k1_fe_sqrt(&r->y,&local_58);
  secp256k1_fe_impl_normalize_var(&r->y);
  uVar5 = (r->y).n[0];
  if (((uint)uVar5 & 1) != odd) {
    (r->y).n[0] = 0x3ffffbfffff0bc - uVar5;
    uVar5 = (r->y).n[2];
    uVar104 = (r->y).n[3];
    uVar105 = (r->y).n[4];
    (r->y).n[1] = 0x3ffffffffffffc - (r->y).n[1];
    (r->y).n[2] = 0x3ffffffffffffc - uVar5;
    (r->y).n[3] = 0x3ffffffffffffc - uVar104;
    (r->y).n[4] = 0x3fffffffffffc - uVar105;
  }
  return iVar106;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    secp256k1_fe x2, x3;
    int ret;
    SECP256K1_FE_VERIFY(x);

    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    ret = secp256k1_fe_sqrt(&r->y, &x3);
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }

    SECP256K1_GE_VERIFY(r);
    return ret;
}